

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discover.cc
# Opt level: O0

void __thiscall rcdiscover::Discover::broadcastRequest(Discover *this)

{
  bool bVar1;
  reference this_00;
  reference __args;
  reference __n;
  void *__buf;
  int in_R8D;
  NetworkUnreachableException *anon_var_0;
  SocketLinux *socket;
  iterator __end1;
  iterator __begin1;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> discovery_cmd;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>
  *in_stack_ffffffffffffff38;
  vector<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
  *in_stack_ffffffffffffff40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  allocator_type *__a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff70;
  initializer_list<unsigned_char> in_stack_ffffffffffffff78;
  __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
  local_60 [4];
  allocator_type local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  undefined1 *local_30;
  undefined8 local_28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  std::
  vector<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
  ::clear((vector<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
           *)0x11d875);
  local_38 = 0x42;
  local_37 = 0x11;
  local_36 = 0;
  local_35 = 2;
  local_34 = 0;
  local_33 = 0;
  local_32 = 0;
  local_31 = 0;
  local_30 = &local_38;
  local_28 = 8;
  __a = &local_39;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x11d8e3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,__a);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x11d914);
  local_60[0]._M_current =
       (SocketLinux *)
       std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::begin
                 (in_stack_ffffffffffffff38);
  std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::end
            (in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
                        *)in_stack_ffffffffffffff40,
                       (__normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
              ::operator*(local_60);
    __n = this_00;
    GigERequestCounter::getNext();
    std::
    vector<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
    ::push_back(in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
    __args = std::
             vector<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
             ::back(in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff50 = &local_20;
    in_stack_ffffffffffffff38 =
         (vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                   (in_stack_ffffffffffffff50,6);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              (in_stack_ffffffffffffff50,7);
    in_stack_ffffffffffffff40 =
         (vector<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
          *)&stack0xffffffffffffff78;
    std::tie<unsigned_char,unsigned_char>((uchar *)__args,(uchar *)in_stack_ffffffffffffff40);
    std::tuple<unsigned_char&,unsigned_char&>::operator=
              ((tuple<unsigned_char_&,_unsigned_char_&> *)in_stack_ffffffffffffff40,
               (tuple<unsigned_char,_unsigned_char> *)in_stack_ffffffffffffff38);
    Socket<rcdiscover::SocketLinux>::send
              (&this_00->super_Socket<rcdiscover::SocketLinux>,(int)in_stack_ffffffffffffff50,__buf,
               (size_t)__n,in_R8D);
    __gnu_cxx::
    __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
    ::operator++(local_60);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff50);
  return;
}

Assistant:

void Discover::broadcastRequest()
{
  req_nums_.clear();

  std::vector<uint8_t> discovery_cmd{0x42, 0x11, 0, 0x02, 0, 0, 0, 0};

  for (auto &socket : sockets_)
  {
    req_nums_.push_back(GigERequestCounter::getNext());
    std::tie(discovery_cmd[6], discovery_cmd[7]) = req_nums_.back();

    try
    {
      socket.send(discovery_cmd);
    }
    catch(const NetworkUnreachableException &)
    {
      continue;
    }
  }
}